

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImpl::processJoystickEvents(WindowImpl *this)

{
  float fVar1;
  JoystickManager *this_00;
  JoystickState *__src;
  WindowImpl *this_01;
  JoystickCaps *pJVar2;
  WindowImpl *in_RDI;
  float extraout_XMM0_Da;
  Event event_2;
  bool currPressed;
  bool prevPressed;
  uint j_1;
  Event event_1;
  float currPos;
  float prevPos;
  Axis axis;
  uint j;
  JoystickCaps caps;
  Event event;
  bool connected;
  JoystickState previousState;
  uint i;
  Event *in_stack_ffffffffffffff38;
  WindowImpl *pWVar3;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined6 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5e;
  byte in_stack_ffffffffffffff5f;
  uint in_stack_ffffffffffffff60;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff64;
  uint local_7c;
  undefined8 local_78;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  uint local_64;
  byte local_51;
  byte local_50 [36];
  byte abStack_2c [32];
  uint local_c;
  
  JoystickManager::getInstance();
  JoystickManager::update((JoystickManager *)previousState.buttons._20_8_);
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    memcpy(local_50,in_RDI->m_joystickStates + local_c,0x44);
    this_00 = JoystickManager::getInstance();
    __src = JoystickManager::getState(this_00,local_c);
    memcpy(in_RDI->m_joystickStates + local_c,__src,0x44);
    local_51 = in_RDI->m_joystickStates[local_c].connected & 1;
    if ((local_50[0] & 1) != local_51) {
      local_68 = 0x12;
      if (local_51 != 0) {
        local_68 = 0x11;
      }
      local_64 = local_c;
      pushEvent(in_RDI,in_stack_ffffffffffffff38);
      if ((local_51 & 1) != 0) {
        local_6c = 0;
        std::fill_n<float*,unsigned_long,float>
                  ((float *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   CONCAT17(in_stack_ffffffffffffff5f,
                            CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)),
                   (float *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
    if ((local_51 & 1) != 0) {
      this_01 = (WindowImpl *)JoystickManager::getInstance();
      pJVar2 = JoystickManager::getCapabilities((JoystickManager *)this_01,local_c);
      local_78._0_4_ = pJVar2->buttonCount;
      local_78._4_1_ = pJVar2->axes[0];
      local_78._5_1_ = pJVar2->axes[1];
      local_78._6_1_ = pJVar2->axes[2];
      local_78._7_1_ = pJVar2->axes[3];
      local_70 = *(undefined4 *)(pJVar2->axes + 4);
      for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
        pWVar3 = in_RDI;
        if ((*(byte *)((long)&local_78 + (ulong)local_7c + 4) & 1) != 0) {
          fVar1 = in_RDI->m_joystickStates[local_c].axes[local_7c];
          std::abs((int)this_01);
          pWVar3 = in_RDI;
          if (in_RDI->m_joystickThreshold <= extraout_XMM0_Da) {
            in_stack_ffffffffffffff64 = 0x10;
            pushEvent(in_RDI,in_stack_ffffffffffffff38);
            pWVar3->m_previousAxes[local_c][local_7c] = fVar1;
            this_01 = in_RDI;
          }
        }
        in_RDI = pWVar3;
      }
      in_stack_ffffffffffffff60 = 0;
      while (in_stack_ffffffffffffff60 < (uint)local_78) {
        in_stack_ffffffffffffff5f = abStack_2c[in_stack_ffffffffffffff60] & 1;
        in_stack_ffffffffffffff5e =
             in_RDI->m_joystickStates[local_c].buttons[in_stack_ffffffffffffff60] & 1;
        uVar4 = in_stack_ffffffffffffff60;
        if (in_stack_ffffffffffffff5f != in_stack_ffffffffffffff5e) {
          pushEvent(in_RDI,in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff50 = in_stack_ffffffffffffff60;
        }
        in_stack_ffffffffffffff60 = uVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void WindowImpl::processJoystickEvents()
{
    // First update the global joystick states
    JoystickManager::getInstance().update();

    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        // Copy the previous state of the joystick and get the new one
        JoystickState previousState = m_joystickStates[i];
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);

        // Connection state
        bool connected = m_joystickStates[i].connected;
        if (previousState.connected ^ connected)
        {
            Event event;
            event.type = connected ? Event::JoystickConnected : Event::JoystickDisconnected;
            event.joystickConnect.joystickId = i;
            pushEvent(event);

            // Clear previous axes positions
            if (connected)
                std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
        }

        if (connected)
        {
            JoystickCaps caps = JoystickManager::getInstance().getCapabilities(i);

            // Axes
            for (unsigned int j = 0; j < Joystick::AxisCount; ++j)
            {
                if (caps.axes[j])
                {
                    Joystick::Axis axis = static_cast<Joystick::Axis>(j);
                    float prevPos = m_previousAxes[i][axis];
                    float currPos = m_joystickStates[i].axes[axis];
                    if (std::abs(currPos - prevPos) >= m_joystickThreshold)
                    {
                        Event event;
                        event.type = Event::JoystickMoved;
                        event.joystickMove.joystickId = i;
                        event.joystickMove.axis = axis;
                        event.joystickMove.position = currPos;
                        pushEvent(event);

                        m_previousAxes[i][axis] = currPos;
                    }
                }
            }

            // Buttons
            for (unsigned int j = 0; j < caps.buttonCount; ++j)
            {
                bool prevPressed = previousState.buttons[j];
                bool currPressed = m_joystickStates[i].buttons[j];

                if (prevPressed ^ currPressed)
                {
                    Event event;
                    event.type = currPressed ? Event::JoystickButtonPressed : Event::JoystickButtonReleased;
                    event.joystickButton.joystickId = i;
                    event.joystickButton.button = j;
                    pushEvent(event);
                }
            }
        }
    }
}